

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O2

void read_access_unit_delimiter_rbsp(h264_stream_t *h,bs_t *b)

{
  uint32_t uVar1;
  
  uVar1 = bs_read_u(b,3);
  h->aud->primary_pic_type = uVar1;
  return;
}

Assistant:

void read_access_unit_delimiter_rbsp(h264_stream_t* h, bs_t* b)
{
    h->aud->primary_pic_type = bs_read_u(b, 3);
}